

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtObj.c
# Opt level: O2

void NewtClearMapFlags(newtRefArg map,int32_t bit)

{
  newtRef nVar1;
  ulong uVar2;
  
  nVar1 = NcClassOf(map);
  uVar2 = NewtRefToInteger(nVar1);
  nVar1 = NewtMakeInteger((long)~bit & uVar2);
  NcSetClass(map,nVar1);
  return;
}

Assistant:

void NewtClearMapFlags(newtRefArg map, int32_t bit)
{
    int64_t	flags;
    
    flags = NewtRefToInteger(NcClassOf(map));
    flags &= ~ bit;
    NcSetClass(map, NewtMakeInteger(flags));
}